

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcSectionedSpine::~IfcSectionedSpine(IfcSectionedSpine *this)

{
  void *pvVar1;
  
  this[-1].CrossSectionPositions.
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__IfcSectionedSpine_008ae3e0;
  (this->CrossSections).
  super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
  .
  super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__IfcSectionedSpine_008ae458;
  *(undefined ***)&this[-1].field_0x70 = &PTR__IfcSectionedSpine_008ae408;
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcSectionedSpine_008ae430;
  pvVar1 = *(void **)&(this->super_IfcGeometricRepresentationItem).field_0x30;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,(long)(this->CrossSections).
                                 super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
                                 .
                                 super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProfileDef>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1);
  }
  pvVar1 = *(void **)&(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                      super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                      field_0x18;
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)&(this->super_IfcGeometricRepresentationItem).field_0x28 -
                           (long)pvVar1);
    return;
  }
  return;
}

Assistant:

IfcSectionedSpine() : Object("IfcSectionedSpine") {}